

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcZShapeProfileDef::~IfcZShapeProfileDef(IfcZShapeProfileDef *this)

{
  bool *pbVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x68 =
       0x884b18;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.ProfileName.have =
       0x884b40;
  pbVar1 = &this[-1].FilletRadius.have;
  if ((bool *)this[-1].FlangeThickness != pbVar1) {
    operator_delete((undefined1 *)this[-1].FlangeThickness,*(long *)pbVar1 + 1);
  }
  puVar2 = *(undefined1 **)&this[-1].super_IfcParameterizedProfileDef.field_0x78;
  if ((Out *)puVar2 != &this[-1].FlangeWidth) {
    operator_delete(puVar2,(long)this[-1].FlangeWidth + 1);
  }
  operator_delete(&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x68,0xd8);
  return;
}

Assistant:

IfcZShapeProfileDef() : Object("IfcZShapeProfileDef") {}